

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_recv_start(uv_udp_t *handle,uv_alloc_cb alloc_cb,uv_udp_recv_cb recv_cb)

{
  int iVar1;
  uv_loop_t *in_RDX;
  long in_RSI;
  long in_RDI;
  int err;
  uint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int local_4;
  
  if ((in_RSI == 0) || (in_RDX == (uv_loop_t *)0x0)) {
    local_4 = -0x16;
  }
  else {
    iVar1 = uv__io_active((uv__io_t *)in_RDX,in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      local_4 = uv__udp_maybe_deferred_bind(handle,alloc_cb._4_4_);
      if (local_4 == 0) {
        *(long *)(in_RDI + 0x40) = in_RSI;
        *(uv_loop_t **)(in_RDI + 0x48) = in_RDX;
        uv__io_start(in_RDX,(uv__io_t *)(ulong)in_stack_ffffffffffffffd8,0);
        if (((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) &&
           (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) | 0x4000,
           (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
          *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + 1;
        }
        local_4 = 0;
      }
    }
    else {
      local_4 = -0x72;
    }
  }
  return local_4;
}

Assistant:

int uv__udp_recv_start(uv_udp_t* handle,
                       uv_alloc_cb alloc_cb,
                       uv_udp_recv_cb recv_cb) {
  int err;

  if (alloc_cb == NULL || recv_cb == NULL)
    return -EINVAL;

  if (uv__io_active(&handle->io_watcher, UV__POLLIN))
    return -EALREADY;  /* FIXME(bnoordhuis) Should be -EBUSY. */

  err = uv__udp_maybe_deferred_bind(handle, AF_INET);
  if (err)
    return err;

  handle->alloc_cb = alloc_cb;
  handle->recv_cb = recv_cb;

  uv__io_start(handle->loop, &handle->io_watcher, UV__POLLIN);
  uv__handle_start(handle);

  return 0;
}